

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O0

void initHashMap(Mesh *mesh,VectorXd *x,double epsilon)

{
  bool bVar1;
  VectorT<int,_2> *__x;
  Index IVar2;
  CoeffReturnType pdVar3;
  double in_XMM0_Qa;
  Vec2i idx;
  VertexHandle handle;
  int i;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_stack_ffffffffffffff90;
  VectorT<int,2> *this;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
  in_stack_ffffffffffffffa8;
  pair<OpenMesh::VectorT<int,_2>,_int> in_stack_ffffffffffffffb0;
  VectorT<int,2> local_2c [8];
  undefined4 local_24;
  undefined4 local_20;
  int local_1c;
  double local_18;
  
  local_18 = in_XMM0_Qa;
  std::
  unordered_multimap<OpenMesh::VectorT<int,_2>,_int,_myHash,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>_>
  ::clear((unordered_multimap<OpenMesh::VectorT<int,_2>,_int,_myHash,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>_>
           *)0x1cb970);
  local_1c = 0;
  while( true ) {
    __x = (VectorT<int,_2> *)(long)local_1c;
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_ffffffffffffff90);
    if (IVar2 <= (long)__x) break;
    OpenMesh::VertexHandle::VertexHandle
              ((VertexHandle *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_24 = local_20;
    bVar1 = OpenMesh::PolyConnectivity::is_boundary
                      ((PolyConnectivity *)in_stack_ffffffffffffffa8._M_cur,
                       (BaseHandle)in_stack_ffffffffffffffb0.first.values_._M_elems[1]);
    if (bVar1) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         (in_stack_ffffffffffffff90,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff90 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)(*pdVar3 / local_18);
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         (in_stack_ffffffffffffff90,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      this = local_2c;
      OpenMesh::VectorT<int,2>::VectorT<double,double,void,void>
                (this,(double)in_stack_ffffffffffffff90,*pdVar3 / local_18);
      in_stack_ffffffffffffffb0 = std::make_pair<OpenMesh::VectorT<int,2>&,int>(__x,(int *)this);
      in_stack_ffffffffffffffa8._M_cur =
           (__node_type *)
           std::
           unordered_multimap<OpenMesh::VectorT<int,2>,int,myHash,std::equal_to<OpenMesh::VectorT<int,2>>,std::allocator<std::pair<OpenMesh::VectorT<int,2>const,int>>>
           ::insert<std::pair<OpenMesh::VectorT<int,2>,int>>
                     ((unordered_multimap<OpenMesh::VectorT<int,_2>,_int,_myHash,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (pair<OpenMesh::VectorT<int,_2>,_int> *)0x1cba79);
    }
    local_1c = local_1c + 2;
  }
  return;
}

Assistant:

void initHashMap(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    neighbors.clear();
    for (int i = 0; i < x.size(); i += 2) {
        OpenMesh::VertexHandle handle(i / 2);
        if (mesh.is_boundary(handle)) {
            OpenMesh::Vec2i idx(x[i] / epsilon, x[i + 1] / epsilon);
            neighbors.insert(std::make_pair(idx, i / 2));
        }
    }
}